

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

SourceLocation __thiscall
slang::SourceManager::createExpansionLoc
          (SourceManager *this,SourceLocation originalLoc,SourceRange expansionRange,
          string_view macroName)

{
  string_view name;
  string_view macroName_00;
  SourceRange expansionRange_00;
  size_type sVar1;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  mutex_type *in_RDI;
  SourceLocation *in_R8;
  char *in_R9;
  unique_lock<std::shared_mutex> lock;
  unique_lock<std::shared_mutex> *in_stack_ffffffffffffff30;
  unique_lock<std::shared_mutex> *this_00;
  ExpansionInfo *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  BufferID buffer;
  BufferID local_b8 [4];
  SourceLocation *local_a8;
  char *pcStack_a0;
  SourceLocation local_98;
  SourceLocation SStack_90;
  SourceLocation local_80;
  ExpansionInfo local_78;
  SourceLocation *local_30;
  char *pcStack_28;
  SourceLocation local_20;
  SourceLocation SStack_18;
  SourceLocation local_10;
  SourceLocation local_8;
  
  local_30 = in_R8;
  pcStack_28 = in_R9;
  local_20 = in_RDX;
  SStack_18 = in_RCX;
  local_10 = in_RSI;
  std::unique_lock<std::shared_mutex>::unique_lock(in_stack_ffffffffffffff30,in_RDI);
  this_00 = (unique_lock<std::shared_mutex> *)(in_RDI + 2);
  local_80 = local_10;
  local_98 = local_20;
  SStack_90 = SStack_18;
  local_a8 = local_30;
  pcStack_a0 = pcStack_28;
  expansionRange_00.endLoc = SStack_18;
  expansionRange_00.startLoc = local_20;
  macroName_00._M_str = pcStack_28;
  macroName_00._M_len = (size_t)local_30;
  ExpansionInfo::ExpansionInfo(&local_78,local_10,expansionRange_00,macroName_00);
  std::
  vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
  ::emplace_back<slang::SourceManager::ExpansionInfo>
            ((vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  sVar1 = std::
          vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
          ::size((vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                  *)(in_RDI + 2));
  buffer.id = (uint32_t)((ulong)pcStack_28 >> 0x20);
  name._M_str._0_4_ = (int)pcStack_28;
  name._M_len = (size_t)local_30;
  name._M_str._4_4_ = buffer.id;
  BufferID::BufferID(local_b8,(int)sVar1 - 1,name);
  SourceLocation::SourceLocation(local_30,buffer,(uint64_t)this_00);
  std::unique_lock<std::shared_mutex>::~unique_lock(this_00);
  return local_8;
}

Assistant:

SourceLocation SourceManager::createExpansionLoc(SourceLocation originalLoc,
                                                 SourceRange expansionRange,
                                                 std::string_view macroName) {
    std::unique_lock<std::shared_mutex> lock(mutex);

    bufferEntries.emplace_back(ExpansionInfo(originalLoc, expansionRange, macroName));
    return SourceLocation(BufferID((uint32_t)(bufferEntries.size() - 1), macroName), 0);
}